

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalWrapper.cpp
# Opt level: O2

Expression * __thiscall IRT::ConditionalWrapper::ToExpression(ConditionalWrapper *this)

{
  int iVar1;
  TempExpression *this_00;
  SeqStatement *this_01;
  MoveStatement *pMVar2;
  ConstExpression *pCVar3;
  SeqStatement *this_02;
  undefined4 extraout_var;
  SeqStatement *this_03;
  LabelStatement *this_04;
  SeqStatement *this_05;
  LabelStatement *this_06;
  string local_148 [32];
  string local_128 [32];
  Label local_108;
  Label local_e8;
  undefined1 local_c8 [8];
  Label label_false;
  undefined1 local_98 [8];
  Label label_true;
  
  this_00 = (TempExpression *)operator_new(0x28);
  Temporary::Temporary((Temporary *)local_98);
  TempExpression::TempExpression(this_00,(Temporary *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  Label::Label((Label *)local_98);
  Label::Label((Label *)local_c8);
  label_true.label_.field_2._8_8_ = operator_new(0x18);
  this_01 = (SeqStatement *)operator_new(0x18);
  pMVar2 = (MoveStatement *)operator_new(0x18);
  pCVar3 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(pCVar3,1);
  MoveStatement::MoveStatement(pMVar2,(Expression *)this_00,(Expression *)pCVar3);
  this_02 = (SeqStatement *)operator_new(0x18);
  std::__cxx11::string::string(local_148,(string *)local_98);
  std::__cxx11::string::string(local_128,(string *)local_c8);
  iVar1 = (*(this->super_SubtreeWrapper)._vptr_SubtreeWrapper[4])(this,local_148,local_128);
  this_03 = (SeqStatement *)operator_new(0x18);
  this_04 = (LabelStatement *)operator_new(0x28);
  label_false.label_.field_2._8_8_ = pMVar2;
  std::__cxx11::string::string((string *)&local_108,(string *)local_c8);
  LabelStatement::LabelStatement(this_04,&local_108);
  this_05 = (SeqStatement *)operator_new(0x18);
  pMVar2 = (MoveStatement *)operator_new(0x18);
  pCVar3 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(pCVar3,0);
  MoveStatement::MoveStatement(pMVar2,(Expression *)this_00,(Expression *)pCVar3);
  this_06 = (LabelStatement *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_e8,(string *)local_98);
  LabelStatement::LabelStatement(this_06,&local_e8);
  SeqStatement::SeqStatement(this_05,(Statement *)pMVar2,(Statement *)this_06);
  SeqStatement::SeqStatement(this_03,(Statement *)this_04,(Statement *)this_05);
  SeqStatement::SeqStatement(this_02,(Statement *)CONCAT44(extraout_var,iVar1),(Statement *)this_03)
  ;
  SeqStatement::SeqStatement
            (this_01,(Statement *)label_false.label_.field_2._8_8_,(Statement *)this_02);
  EseqExpression::EseqExpression
            ((EseqExpression *)label_true.label_.field_2._8_8_,(Statement *)this_01,
             (Expression *)this_00);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_98);
  return (Expression *)label_true.label_.field_2._8_8_;
}

Assistant:

Expression *IRT::ConditionalWrapper::ToExpression() {
    auto* temp_expression = new TempExpression(Temporary());
    Label label_true;
    Label label_false;
    return new EseqExpression(
      new SeqStatement(
        new MoveStatement(temp_expression, new ConstExpression(1)),
        new SeqStatement(
          ToConditional(label_true, label_false),
          new SeqStatement(
            new LabelStatement(label_false),
            new SeqStatement(
              new MoveStatement(temp_expression, new ConstExpression(0)),
              new LabelStatement(label_true)
            )
          )
        )
      ),
      temp_expression
    );
}